

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O0

void __thiscall helix::nasdaq::itch50_handler::process_msg(itch50_handler *this,itch50_trade *m)

{
  bool bVar1;
  __uint32_t _Var2;
  pointer ppVar3;
  long in_RSI;
  uint64_t in_RDI;
  trade t;
  uint64_t timestamp;
  order_book *ob;
  uint32_t quantity;
  uint64_t trade_price;
  iterator it;
  event *in_stack_ffffffffffffff28;
  trade *this_00;
  string *in_stack_ffffffffffffff48;
  trade local_a8 [2];
  trade local_68;
  uint64_t local_48;
  order_book *local_40;
  __uint32_t local_34;
  ulong local_30;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false> local_28;
  ulong local_20;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false> local_18;
  long local_10;
  
  local_20 = (ulong)*(ushort *)(in_RSI + 1);
  local_10 = in_RSI;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
       ::find((unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
               *)in_stack_ffffffffffffff28,(key_type *)0x141ac9);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
       ::end((unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
              *)in_stack_ffffffffffffff28);
  bVar1 = std::__detail::operator!=(&local_18,&local_28);
  if (bVar1) {
    _Var2 = __bswap_32(*(__uint32_t *)(local_10 + 0x20));
    local_30 = (ulong)_Var2;
    local_34 = __bswap_32(*(__uint32_t *)(local_10 + 0x14));
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_helix::order_book>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_helix::order_book>,_false,_false>
                         *)0x141b43);
    local_40 = &ppVar3->second;
    local_48 = itch50_timestamp(0x141b6c);
    this_00 = &local_68;
    trade::trade(this_00,local_48,local_30,(ulong)local_34,non_displayable);
    order_book::symbol_abi_cxx11_(local_40);
    make_trade_event(in_stack_ffffffffffffff48,in_RDI,local_a8,(event_mask)((ulong)this_00 >> 0x20))
    ;
    std::function<void_(const_helix::event_&)>::operator()
              ((function<void_(const_helix::event_&)> *)this_00,in_stack_ffffffffffffff28);
    event::~event((event *)0x141bec);
  }
  return;
}

Assistant:

void itch50_handler::process_msg(const itch50_trade* m)
{
    auto it = order_book_id_map.find(m->StockLocate);
    if (it != order_book_id_map.end()) {
        uint64_t trade_price = be32toh(m->Price);
        uint32_t quantity = be32toh(m->Shares);
        auto& ob = it->second;
        auto timestamp = itch50_timestamp(m->Timestamp);
        trade t{timestamp, trade_price, quantity, trade_sign::non_displayable};
        _process_event(make_trade_event(ob.symbol(), timestamp, &t));
    }
}